

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_InitShadeMaps(void)

{
  byte *pbVar1;
  BYTE *pBVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int k;
  long lVar11;
  
  pBVar2 = shadetables;
  iVar3 = 0x20;
  iVar4 = 0x10;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    ShadeFakeColormap[lVar7].Color.field_0.d = 0xffffffff;
    ShadeFakeColormap[lVar7].Desaturate = -1;
    ShadeFakeColormap[lVar7].Next = (FDynamicColormap *)0x0;
    ShadeFakeColormap[lVar7].Maps = pBVar2;
    iVar8 = 0;
    uVar9 = 0x2000;
    while( true ) {
      if (iVar8 == 0x20) break;
      iVar10 = (int)(uVar9 >> 5);
      uVar5 = iVar3 * iVar10 + 0x100;
      for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
        bVar6 = (byte)(uVar5 >> 0xe);
        if (0x3f < bVar6) {
          bVar6 = 0x40;
        }
        pBVar2[lVar11] = bVar6;
        uVar5 = uVar5 + iVar10 * iVar4;
      }
      pBVar2 = pBVar2 + 0x100;
      iVar8 = iVar8 + 1;
      uVar9 = uVar9 - 0x100;
    }
    iVar3 = iVar3 + -2;
    iVar4 = iVar4 + -1;
  }
  lVar7 = 0;
  do {
    if (lVar7 == 0x20000) {
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        identitymap[lVar7] = (BYTE)lVar7;
      }
      return;
    }
    pbVar1 = shadetables + lVar7;
    lVar7 = lVar7 + 1;
  } while (*pbVar1 < 0x41);
  __assert_fail("shadetables[i] <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_draw.cpp"
                ,0x9c,"void R_InitShadeMaps()");
}

Assistant:

void R_InitShadeMaps()
{
	int i,j;
	// set up shading tables for shaded columns
	// 16 colormap sets, progressing from full alpha to minimum visible alpha

	BYTE *table = shadetables;

	// Full alpha
	for (i = 0; i < 16; ++i)
	{
		ShadeFakeColormap[i].Color = ~0u;
		ShadeFakeColormap[i].Desaturate = ~0u;
		ShadeFakeColormap[i].Next = NULL;
		ShadeFakeColormap[i].Maps = table;

		for (j = 0; j < NUMCOLORMAPS; ++j)
		{
			int a = (NUMCOLORMAPS - j) * 256 / NUMCOLORMAPS * (16-i);
			for (int k = 0; k < 256; ++k)
			{
				BYTE v = (((k+2) * a) + 256) >> 14;
				table[k] = MIN<BYTE> (v, 64);
			}
			table += 256;
		}
	}
	for (i = 0; i < NUMCOLORMAPS*16*256; ++i)
	{
		assert(shadetables[i] <= 64);
	}

	// Set up a guaranteed identity map
	for (i = 0; i < 256; ++i)
	{
		identitymap[i] = i;
	}
}